

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int aRet;
  int extraout_EAX;
  
  aRet = sqlite3_bind_blob((this->mStmtPtr).mpStmt,__fd,__addr,__len,
                           (_func_void_void_ptr *)0xffffffffffffffff);
  check(this,aRet);
  return extraout_EAX;
}

Assistant:

void Statement::bind(const int aIndex, const void* apValue, const int aSize)
{
    const int ret = sqlite3_bind_blob(mStmtPtr, aIndex, apValue, aSize, SQLITE_TRANSIENT);
    check(ret);
}